

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3AddColumn(Parse *pParse,Token sName,Token sType)

{
  Table *pTVar1;
  u8 uVar2;
  int iVar3;
  char *pcVar4;
  Column *zIn;
  Column *__s;
  char *in_RCX;
  uint in_EDX;
  char *in_RSI;
  Parse *in_RDI;
  uint in_R8D;
  long in_FS_OFFSET;
  char affinity;
  u8 szEst;
  u8 eType;
  Column *aNew;
  u8 hName;
  sqlite3 *db;
  Column *pCol;
  char *zType;
  char *z;
  int i;
  Table *p;
  char *in_stack_ffffffffffffff78;
  sqlite3 *in_stack_ffffffffffffff80;
  uint in_stack_ffffffffffffff88;
  uint uVar5;
  undefined1 in_stack_ffffffffffffff8c;
  char cVar6;
  u8 uVar7;
  char cVar8;
  Parse *pParse_00;
  int local_3c;
  Token local_28;
  Token local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pParse_00 = (Parse *)&DAT_aaaaaaaaaaaaaaaa;
  cVar8 = '\0';
  uVar7 = '\x01';
  cVar6 = 'A';
  pTVar1 = in_RDI->pNewTable;
  local_28.n = in_R8D;
  if (pTVar1 != (Table *)0x0) {
    if (in_RDI->db->aLimit[2] < pTVar1->nCol + 1) {
      sqlite3ErrorMsg(in_RDI,"too many columns on %s",pTVar1->zName);
    }
    else {
      local_28.z = in_RCX;
      local_18.z = in_RSI;
      local_18.n = in_EDX;
      if (in_RDI->eParseMode < 2) {
        sqlite3DequoteToken(&local_18);
      }
      if ((0xf < local_28.n) &&
         (iVar3 = sqlite3_strnicmp(local_28.z + (local_28.n - 6),"always",6), iVar3 == 0)) {
        local_28.n = local_28.n - 6;
        while( true ) {
          in_stack_ffffffffffffff8c = false;
          if (local_28.n != 0) {
            in_stack_ffffffffffffff8c = (""[(byte)local_28.z[local_28.n - 1]] & 1) != 0;
          }
          if ((bool)in_stack_ffffffffffffff8c == false) break;
          local_28.n = local_28.n - 1;
        }
        if ((8 < local_28.n) &&
           (iVar3 = sqlite3_strnicmp(local_28.z + (local_28.n - 9),"generated",9), iVar3 == 0)) {
          local_28.n = local_28.n - 9;
          uVar5 = in_stack_ffffffffffffff88;
          while( true ) {
            in_stack_ffffffffffffff88 = uVar5 & 0xffffff;
            if (local_28.n != 0) {
              in_stack_ffffffffffffff88 =
                   CONCAT13((""[(byte)local_28.z[local_28.n - 1]] & 1) != 0,(int3)uVar5);
            }
            if ((char)(in_stack_ffffffffffffff88 >> 0x18) == '\0') break;
            local_28.n = local_28.n - 1;
            uVar5 = in_stack_ffffffffffffff88;
          }
        }
      }
      if (2 < local_28.n) {
        sqlite3DequoteToken(&local_28);
        for (local_3c = 0; local_3c < 6; local_3c = local_3c + 1) {
          if ((local_28.n == "\x03\x04\x03\a\x04\x04"[local_3c]) &&
             (iVar3 = sqlite3_strnicmp(local_28.z,sqlite3StdType[local_3c],local_28.n), iVar3 == 0))
          {
            local_28.n = 0;
            cVar8 = (char)local_3c + '\x01';
            cVar6 = "CADDEB"[local_3c];
            if (cVar6 < 'C') {
              uVar7 = '\x05';
            }
            break;
          }
        }
      }
      pcVar4 = (char *)sqlite3DbMallocRaw((sqlite3 *)
                                          CONCAT17(cVar8,CONCAT16(uVar7,CONCAT15(cVar6,CONCAT14(
                                                  in_stack_ffffffffffffff8c,
                                                  in_stack_ffffffffffffff88)))),
                                          (u64)in_stack_ffffffffffffff80);
      if (pcVar4 != (char *)0x0) {
        if (1 < in_RDI->eParseMode) {
          sqlite3RenameTokenMap
                    (pParse_00,
                     (void *)CONCAT17(cVar8,CONCAT16(uVar7,CONCAT15(cVar6,CONCAT14(
                                                  in_stack_ffffffffffffff8c,
                                                  in_stack_ffffffffffffff88)))),
                     (Token *)in_stack_ffffffffffffff80);
        }
        memcpy(pcVar4,local_18.z,(ulong)local_18.n);
        pcVar4[local_18.n] = '\0';
        sqlite3Dequote(pcVar4);
        uVar2 = sqlite3StrIHash(pcVar4);
        for (local_3c = 0; local_3c < pTVar1->nCol; local_3c = local_3c + 1) {
          if ((pTVar1->aCol[local_3c].hName == uVar2) &&
             (iVar3 = sqlite3StrICmp(pcVar4,pTVar1->aCol[local_3c].zCnName), iVar3 == 0)) {
            sqlite3ErrorMsg(in_RDI,"duplicate column name: %s",pcVar4);
            sqlite3DbFree(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
            goto LAB_001ae36e;
          }
        }
        zIn = (Column *)
              sqlite3DbRealloc((sqlite3 *)
                               CONCAT17(cVar8,CONCAT16(uVar7,CONCAT15(cVar6,CONCAT14(
                                                  in_stack_ffffffffffffff8c,
                                                  in_stack_ffffffffffffff88)))),
                               in_stack_ffffffffffffff80,(u64)in_stack_ffffffffffffff78);
        if (zIn == (Column *)0x0) {
          sqlite3DbFree(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
        }
        else {
          pTVar1->aCol = zIn;
          __s = pTVar1->aCol + pTVar1->nCol;
          memset(__s,0,0x10);
          __s->zCnName = pcVar4;
          __s->hName = uVar2;
          if (local_28.n == 0) {
            __s->affinity = cVar6;
            __s->field_0x8 = __s->field_0x8 & 0xf | cVar8 << 4;
            __s->szEst = uVar7;
          }
          else {
            iVar3 = sqlite3Strlen30(in_stack_ffffffffffffff78);
            pcVar4 = pcVar4 + (long)iVar3 + 1;
            memcpy(pcVar4,local_28.z,(ulong)local_28.n);
            pcVar4[local_28.n] = '\0';
            sqlite3Dequote(pcVar4);
            cVar6 = sqlite3AffinityType((char *)zIn,
                                        (Column *)
                                        CONCAT17(cVar8,CONCAT16(uVar7,CONCAT15(cVar6,CONCAT14(
                                                  in_stack_ffffffffffffff8c,
                                                  in_stack_ffffffffffffff88)))));
            __s->affinity = cVar6;
            __s->colFlags = __s->colFlags | 4;
          }
          pTVar1->nCol = pTVar1->nCol + 1;
          pTVar1->nNVCol = pTVar1->nNVCol + 1;
          (in_RDI->constraintName).n = 0;
        }
      }
    }
  }
LAB_001ae36e:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3AddColumn(Parse *pParse, Token sName, Token sType){
  Table *p;
  int i;
  char *z;
  char *zType;
  Column *pCol;
  sqlite3 *db = pParse->db;
  u8 hName;
  Column *aNew;
  u8 eType = COLTYPE_CUSTOM;
  u8 szEst = 1;
  char affinity = SQLITE_AFF_BLOB;

  if( (p = pParse->pNewTable)==0 ) return;
  if( p->nCol+1>db->aLimit[SQLITE_LIMIT_COLUMN] ){
    sqlite3ErrorMsg(pParse, "too many columns on %s", p->zName);
    return;
  }
  if( !IN_RENAME_OBJECT ) sqlite3DequoteToken(&sName);

  /* Because keywords GENERATE ALWAYS can be converted into identifiers
  ** by the parser, we can sometimes end up with a typename that ends
  ** with "generated always".  Check for this case and omit the surplus
  ** text. */
  if( sType.n>=16
   && sqlite3_strnicmp(sType.z+(sType.n-6),"always",6)==0
  ){
    sType.n -= 6;
    while( ALWAYS(sType.n>0) && sqlite3Isspace(sType.z[sType.n-1]) ) sType.n--;
    if( sType.n>=9
     && sqlite3_strnicmp(sType.z+(sType.n-9),"generated",9)==0
    ){
      sType.n -= 9;
      while( sType.n>0 && sqlite3Isspace(sType.z[sType.n-1]) ) sType.n--;
    }
  }

  /* Check for standard typenames.  For standard typenames we will
  ** set the Column.eType field rather than storing the typename after
  ** the column name, in order to save space. */
  if( sType.n>=3 ){
    sqlite3DequoteToken(&sType);
    for(i=0; i<SQLITE_N_STDTYPE; i++){
       if( sType.n==sqlite3StdTypeLen[i]
        && sqlite3_strnicmp(sType.z, sqlite3StdType[i], sType.n)==0
       ){
         sType.n = 0;
         eType = i+1;
         affinity = sqlite3StdTypeAffinity[i];
         if( affinity<=SQLITE_AFF_TEXT ) szEst = 5;
         break;
       }
    }
  }

  z = sqlite3DbMallocRaw(db, (i64)sName.n + 1 + (i64)sType.n + (sType.n>0) );
  if( z==0 ) return;
  if( IN_RENAME_OBJECT ) sqlite3RenameTokenMap(pParse, (void*)z, &sName);
  memcpy(z, sName.z, sName.n);
  z[sName.n] = 0;
  sqlite3Dequote(z);
  hName = sqlite3StrIHash(z);
  for(i=0; i<p->nCol; i++){
    if( p->aCol[i].hName==hName && sqlite3StrICmp(z, p->aCol[i].zCnName)==0 ){
      sqlite3ErrorMsg(pParse, "duplicate column name: %s", z);
      sqlite3DbFree(db, z);
      return;
    }
  }
  aNew = sqlite3DbRealloc(db,p->aCol,((i64)p->nCol+1)*sizeof(p->aCol[0]));
  if( aNew==0 ){
    sqlite3DbFree(db, z);
    return;
  }
  p->aCol = aNew;
  pCol = &p->aCol[p->nCol];
  memset(pCol, 0, sizeof(p->aCol[0]));
  pCol->zCnName = z;
  pCol->hName = hName;
  sqlite3ColumnPropertiesFromName(p, pCol);

  if( sType.n==0 ){
    /* If there is no type specified, columns have the default affinity
    ** 'BLOB' with a default size of 4 bytes. */
    pCol->affinity = affinity;
    pCol->eCType = eType;
    pCol->szEst = szEst;
#ifdef SQLITE_ENABLE_SORTER_REFERENCES
    if( affinity==SQLITE_AFF_BLOB ){
      if( 4>=sqlite3GlobalConfig.szSorterRef ){
        pCol->colFlags |= COLFLAG_SORTERREF;
      }
    }
#endif
  }else{
    zType = z + sqlite3Strlen30(z) + 1;
    memcpy(zType, sType.z, sType.n);
    zType[sType.n] = 0;
    sqlite3Dequote(zType);
    pCol->affinity = sqlite3AffinityType(zType, pCol);
    pCol->colFlags |= COLFLAG_HASTYPE;
  }
  p->nCol++;
  p->nNVCol++;
  pParse->constraintName.n = 0;
}